

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_copy_prev_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  bool bVar2;
  wchar_t *local_38;
  wchar_t *dp;
  wchar_t *oldc;
  wchar_t *cp;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).cursor == (el->el_line).buffer) {
    el_local._7_1_ = '\x06';
  }
  else {
    oldc = c__prev_word((el->el_line).cursor,(el->el_line).buffer,(el->el_state).argument,ce__isword
                       );
    c_insert(el,(wchar_t)((long)(el->el_line).cursor - (long)oldc >> 2));
    pwVar1 = (el->el_line).cursor;
    local_38 = pwVar1;
    while( true ) {
      bVar2 = false;
      if (oldc < pwVar1) {
        bVar2 = local_38 < (el->el_line).lastchar;
      }
      if (!bVar2) break;
      *local_38 = *oldc;
      oldc = oldc + 1;
      local_38 = local_38 + 1;
    }
    (el->el_line).cursor = local_38;
    el_local._7_1_ = '\x04';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_copy_prev_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *cp, *oldc, *dp;

	if (el->el_line.cursor == el->el_line.buffer)
		return CC_ERROR;

	/* does a bounds check */
	cp = c__prev_word(el->el_line.cursor, el->el_line.buffer,
	    el->el_state.argument, ce__isword);

	c_insert(el, (int)(el->el_line.cursor - cp));
	oldc = el->el_line.cursor;
	for (dp = oldc; cp < oldc && dp < el->el_line.lastchar; cp++)
		*dp++ = *cp;

	el->el_line.cursor = dp;/* put cursor at end */

	return CC_REFRESH;
}